

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_x86.cpp
# Opt level: O1

int __thiscall ncnn::Cast_x86::forward(Cast_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  uint _c;
  int _elempack;
  _func_int *p_Var2;
  int *piVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  _func_int **pp_Var7;
  unsigned_short uVar8;
  int iVar9;
  void *pvVar10;
  int iVar11;
  int iVar12;
  void *pvVar13;
  ulong uVar14;
  ulong uVar15;
  size_t sVar16;
  uint uVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  float fVar21;
  
  p_Var2 = this->_vptr_Cast_x86[-3];
  if (*(int *)(&this->field_0xd0 + (long)p_Var2) == *(int *)(&this->field_0xd4 + (long)p_Var2)) {
    iVar18 = 0;
    if (top_blob != bottom_blob) {
      piVar3 = bottom_blob->refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + 1;
        UNLOCK();
      }
      piVar3 = top_blob->refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            if (top_blob->data != (void *)0x0) {
              free(top_blob->data);
            }
          }
          else {
            (*top_blob->allocator->_vptr_Allocator[3])();
          }
        }
      }
      top_blob->cstep = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->d = 0;
      top_blob->c = 0;
      piVar3 = bottom_blob->refcount;
      top_blob->data = bottom_blob->data;
      top_blob->refcount = piVar3;
      top_blob->elemsize = bottom_blob->elemsize;
      top_blob->elempack = bottom_blob->elempack;
      top_blob->allocator = bottom_blob->allocator;
      iVar12 = bottom_blob->w;
      iVar11 = bottom_blob->h;
      iVar1 = bottom_blob->d;
      top_blob->dims = bottom_blob->dims;
      top_blob->w = iVar12;
      top_blob->h = iVar11;
      top_blob->d = iVar1;
      top_blob->c = bottom_blob->c;
      top_blob->cstep = bottom_blob->cstep;
    }
  }
  else {
    iVar12 = bottom_blob->w;
    iVar11 = bottom_blob->h;
    iVar1 = bottom_blob->d;
    _c = bottom_blob->c;
    iVar18 = bottom_blob->dims;
    _elempack = bottom_blob->elempack;
    sVar16 = (size_t)_elempack;
    switch(*(int *)(&this->field_0xd4 + (long)p_Var2)) {
    case 1:
      if (*(int *)(&this->field_0xd0 + (long)p_Var2) == 3) {
        Cast::forward((Cast *)((long)&this->_vptr_Cast_x86 + (long)p_Var2),bottom_blob,top_blob,opt)
        ;
      }
      sVar16 = sVar16 * 4;
      break;
    case 2:
    case 4:
      sVar16 = (size_t)(_elempack * 2);
      break;
    case 3:
      break;
    default:
      sVar16 = bottom_blob->elemsize;
    }
    switch(iVar18) {
    case 1:
      Mat::create(top_blob,iVar12,sVar16,_elempack,opt->blob_allocator);
      break;
    case 2:
      Mat::create(top_blob,iVar12,iVar11,sVar16,_elempack,opt->blob_allocator);
      break;
    case 3:
      Mat::create(top_blob,iVar12,iVar11,_c,sVar16,_elempack,opt->blob_allocator);
      break;
    case 4:
      Mat::create(top_blob,iVar12,iVar11,iVar1,_c,sVar16,_elempack,opt->blob_allocator);
    }
    iVar18 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      if ((*(int *)(&this->field_0xd0 + (long)this->_vptr_Cast_x86[-3]) == 1) &&
         ((*(int *)(&this->field_0xd4 + (long)this->_vptr_Cast_x86[-3]) == 2 &&
          (iVar18 = bottom_blob->c, 0 < (long)iVar18)))) {
        iVar9 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
        lVar19 = 0;
        do {
          if (0 < iVar9) {
            sVar16 = top_blob->cstep;
            sVar4 = bottom_blob->cstep;
            sVar5 = top_blob->elemsize;
            pvVar10 = top_blob->data;
            sVar6 = bottom_blob->elemsize;
            pvVar13 = bottom_blob->data;
            lVar20 = 0;
            do {
              uVar8 = float32_to_float16(*(float *)((long)pvVar13 +
                                                   lVar20 * 4 + sVar4 * sVar6 * lVar19));
              *(unsigned_short *)((long)pvVar10 + lVar20 * 2 + sVar16 * sVar5 * lVar19) = uVar8;
              lVar20 = lVar20 + 1;
            } while (iVar9 != (int)lVar20);
          }
          lVar19 = lVar19 + 1;
        } while (lVar19 != iVar18);
      }
      if (((*(int *)(&this->field_0xd0 + (long)this->_vptr_Cast_x86[-3]) == 2) &&
          (*(int *)(&this->field_0xd4 + (long)this->_vptr_Cast_x86[-3]) == 1)) &&
         (iVar18 = bottom_blob->c, 0 < (long)iVar18)) {
        iVar9 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
        lVar19 = 0;
        do {
          if (0 < iVar9) {
            sVar16 = top_blob->cstep;
            sVar4 = bottom_blob->cstep;
            sVar5 = top_blob->elemsize;
            pvVar10 = top_blob->data;
            sVar6 = bottom_blob->elemsize;
            pvVar13 = bottom_blob->data;
            lVar20 = 0;
            do {
              fVar21 = float16_to_float32(*(unsigned_short *)
                                           ((long)pvVar13 + lVar20 * 2 + sVar4 * sVar6 * lVar19));
              *(float *)((long)pvVar10 + lVar20 * 4 + sVar16 * sVar5 * lVar19) = fVar21;
              lVar20 = lVar20 + 1;
            } while (iVar9 != (int)lVar20);
          }
          lVar19 = lVar19 + 1;
        } while (lVar19 != iVar18);
      }
      if ((*(int *)(&this->field_0xd0 + (long)this->_vptr_Cast_x86[-3]) == 3) &&
         (0 < (int)_c && *(int *)(&this->field_0xd4 + (long)this->_vptr_Cast_x86[-3]) == 1)) {
        uVar17 = iVar1 * _elempack * iVar11 * iVar12;
        pvVar10 = bottom_blob->data;
        sVar16 = bottom_blob->cstep;
        pvVar13 = top_blob->data;
        sVar4 = top_blob->cstep;
        sVar5 = top_blob->elemsize;
        sVar6 = bottom_blob->elemsize;
        uVar14 = 0;
        do {
          if (0 < (int)uVar17) {
            uVar15 = 0;
            do {
              *(float *)((long)pvVar13 + uVar15 * 4) = (float)(int)*(char *)((long)pvVar10 + uVar15)
              ;
              uVar15 = uVar15 + 1;
            } while (uVar17 != uVar15);
          }
          uVar14 = uVar14 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar4 * sVar5);
          pvVar10 = (void *)((long)pvVar10 + sVar16 * sVar6);
        } while (uVar14 != _c);
      }
      pp_Var7 = this->_vptr_Cast_x86;
      p_Var2 = pp_Var7[-3];
      if (((*(int *)(&this->field_0xd0 + (long)p_Var2) == 1) &&
          (*(int *)(&this->field_0xd4 + (long)p_Var2) == 4)) &&
         (iVar18 = bottom_blob->c, 0 < (long)iVar18)) {
        iVar12 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
        pvVar10 = bottom_blob->data;
        sVar16 = bottom_blob->elemsize;
        pvVar13 = top_blob->data;
        sVar4 = top_blob->elemsize;
        sVar5 = top_blob->cstep;
        sVar6 = bottom_blob->cstep;
        lVar19 = 0;
        do {
          if (0 < iVar12) {
            lVar20 = 0;
            do {
              *(undefined2 *)((long)pvVar13 + lVar20 * 2) =
                   *(undefined2 *)((long)pvVar10 + lVar20 * 4 + 2);
              lVar20 = lVar20 + 1;
            } while (iVar12 != (int)lVar20);
          }
          lVar19 = lVar19 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar4 * sVar5);
          pvVar10 = (void *)((long)pvVar10 + sVar16 * sVar6);
        } while (lVar19 != iVar18);
      }
      p_Var2 = pp_Var7[-3];
      iVar18 = 0;
      if (((*(int *)(&this->field_0xd0 + (long)p_Var2) == 4) &&
          (iVar18 = 0, *(int *)(&this->field_0xd4 + (long)p_Var2) == 1)) &&
         (iVar12 = bottom_blob->c, 0 < (long)iVar12)) {
        iVar11 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
        pvVar10 = bottom_blob->data;
        sVar16 = bottom_blob->elemsize;
        pvVar13 = top_blob->data;
        sVar4 = top_blob->elemsize;
        sVar5 = top_blob->cstep;
        sVar6 = bottom_blob->cstep;
        lVar19 = 0;
        iVar18 = 0;
        do {
          if (0 < iVar11) {
            lVar20 = 0;
            do {
              *(uint *)((long)pvVar13 + lVar20 * 4) =
                   (uint)*(ushort *)((long)pvVar10 + lVar20 * 2) << 0x10;
              lVar20 = lVar20 + 1;
            } while (iVar11 != (int)lVar20);
          }
          lVar19 = lVar19 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar4 * sVar5);
          pvVar10 = (void *)((long)pvVar10 + sVar16 * sVar6);
        } while (lVar19 != iVar12);
      }
    }
  }
  return iVar18;
}

Assistant:

int Cast_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (type_from == type_to)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    size_t out_elemsize = elemsize;
    if (type_to == 1)
    {
        if (type_from == 3)
        {
            Cast::forward(bottom_blob, top_blob, opt);
        }

        // float32
        out_elemsize = 4 * elempack;
    }
    else if (type_to == 2)
    {
        // float16
        out_elemsize = 2 * elempack;
    }
    else if (type_to == 3)
    {
        // int8
        out_elemsize = elempack;
    }
    else if (type_to == 4)
    {
        // bfloat16
        out_elemsize = 2 * elempack;
    }

    if (dims == 1)
    {
        top_blob.create(w, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 2)
    {
        top_blob.create(w, h, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 3)
    {
        top_blob.create(w, h, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 4)
    {
        top_blob.create(w, h, d, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    int size = w * h * d * elempack;

    if (type_from == 1 && type_to == 2)
    {
        cast_fp32_to_fp16_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 2 && type_to == 1)
    {
        cast_fp16_to_fp32_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 3 && type_to == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const signed char* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                outptr[i] = (float)ptr[i];
            }
        }
    }

    if (type_from == 1 && type_to == 4)
    {
        cast_fp32_to_bf16_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 4 && type_to == 1)
    {
        cast_bf16_to_fp32_sse(bottom_blob, top_blob, opt);
    }

    return 0;
}